

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>::format
          (short_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  long in_RSI;
  memory_buf_t *in_RDI;
  scoped_padder p;
  size_t text_size;
  char *filename;
  scoped_padder p_1;
  scoped_padder *in_stack_ffffffffffffff50;
  scoped_padder *this_00;
  memory_buf_t *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  scoped_padder *in_stack_ffffffffffffff70;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
               (padding_info *)in_stack_ffffffffffffff60,in_RDI);
    scoped_padder::~scoped_padder(in_stack_ffffffffffffff50);
  }
  else {
    basename(*(char **)(in_RSI + 0x38));
    bVar1 = padding_info::enabled((padding_info *)&(in_RDI->super_buffer<char>).size_);
    if (bVar1) {
      this_00 = (scoped_padder *)std::char_traits<char>::length((char_type *)0x26f38d);
    }
    else {
      this_00 = (scoped_padder *)0x0;
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
               (padding_info *)in_stack_ffffffffffffff60,in_RDI);
    ::fmt::v11::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_RDI,(char *)this_00);
    view.size_ = (size_t)in_stack_ffffffffffffff70;
    view.data_ = in_stack_ffffffffffffff68;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffff60);
    scoped_padder::~scoped_padder(this_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }